

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall Runtime::~Runtime(Runtime *this)

{
  VarEnv *this_00;
  bool bVar1;
  reference ppVVar2;
  VarEnv **i;
  iterator __end1;
  iterator __begin1;
  forward_list<VarEnv_*,_std::allocator<VarEnv_*>_> *__range1;
  Runtime *this_local;
  
  __end1 = std::forward_list<VarEnv_*,_std::allocator<VarEnv_*>_>::begin(&this->varEnvs);
  i = (VarEnv **)std::forward_list<VarEnv_*,_std::allocator<VarEnv_*>_>::end(&this->varEnvs);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&i), bVar1) {
    ppVVar2 = std::_Fwd_list_iterator<VarEnv_*>::operator*(&__end1);
    if ((*ppVVar2 != (VarEnv *)0x0) && (this_00 = *ppVVar2, this_00 != (VarEnv *)0x0)) {
      VarEnv::~VarEnv(this_00);
      operator_delete(this_00);
    }
    std::_Fwd_list_iterator<VarEnv_*>::operator++(&__end1);
  }
  std::forward_list<VarEnv_*,_std::allocator<VarEnv_*>_>::~forward_list(&this->varEnvs);
  return;
}

Assistant:

Runtime::~Runtime() {
    for (auto &i: varEnvs) {
        if (i != NULL) {
            delete i;
        }
    }
}